

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

void __thiscall GlobOptBlockData::TrackArgumentsSym(GlobOptBlockData *this,RegOpnd *opnd)

{
  uint uVar1;
  JitArenaAllocator *pJVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  JITTimeFunctionBody *pJVar5;
  FunctionJITTimeInfo *pFVar6;
  char16 *pcVar7;
  char16 *pcVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  wchar local_e8 [4];
  char16 debugStringBuffer [42];
  wchar local_88 [4];
  char16 debugStringBuffer2 [42];
  
  if (this->curFunc->argObjSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3f1274);
    pJVar2 = this->globOpt->alloc;
    pBVar4->head = (Type_conflict)0x0;
    pBVar4->lastFoundIndex = (Type_conflict)0x0;
    pBVar4->alloc = pJVar2;
    pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
    this->curFunc->argObjSyms = pBVar4;
  }
  BVSparse<Memory::JitArenaAllocator>::Set(this->curFunc->argObjSyms,(opnd->m_sym->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Set(this->argObjSyms,(opnd->m_sym->super_Sym).m_id);
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar5);
  pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(pFVar6);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,StackArgOptPhase,sourceContextId,functionId)
  ;
  if (bVar3) {
    uVar1 = (opnd->m_sym->super_Sym).m_id;
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->curFunc->m_workItem);
    pcVar7 = JITTimeFunctionBody::GetDisplayName(pJVar5);
    pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->curFunc->m_workItem);
    pcVar8 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar6,(wchar (*) [42])local_e8);
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->globOpt->func->m_workItem);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar5);
    pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->globOpt->func->m_workItem);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar6,(wchar (*) [42])local_88);
    Output::Print(L"Created a new alias s%d for arguments object in function %s(%s) topFunc %s(%s)\n"
                  ,(ulong)uVar1,pcVar7,pcVar8,pcVar9,pcVar10);
    Output::Flush();
  }
  return;
}

Assistant:

void
GlobOptBlockData::TrackArgumentsSym(IR::RegOpnd const* opnd)
{
    if(!this->curFunc->argObjSyms)
    {
        this->curFunc->argObjSyms = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
    }
    this->curFunc->argObjSyms->Set(opnd->m_sym->m_id);
    this->argObjSyms->Set(opnd->m_sym->m_id);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (PHASE_TESTTRACE(Js::StackArgOptPhase, this->globOpt->func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("Created a new alias s%d for arguments object in function %s(%s) topFunc %s(%s)\n"),
            opnd->m_sym->m_id,
            this->curFunc->GetJITFunctionBody()->GetDisplayName(),
            this->curFunc->GetDebugNumberSet(debugStringBuffer),
            this->globOpt->func->GetJITFunctionBody()->GetDisplayName(),
            this->globOpt->func->GetDebugNumberSet(debugStringBuffer2)
            );
        Output::Flush();
    }
#endif
}